

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::SeparateShaderTest
          (SeparateShaderTest *this,Context *ctx,string *name,string *description,int iterations,
          TestParams *params,TestFunc testFunc)

{
  BindingKind BVar1;
  VaryingInterpolation VVar2;
  VaryingInterpolation VVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  DataType DVar12;
  int iVar13;
  deUint32 seed;
  char *name_00;
  char *description_00;
  RenderContext *pRVar14;
  undefined4 extraout_var;
  TestLog *log;
  TestLog *log_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  TestFunc in_stack_00000010;
  allocator<char> local_79;
  string local_78;
  TestFunc local_48;
  TestFunc testFunc_local;
  TestParams *local_38;
  TestParams *params_local;
  string *psStack_28;
  int iterations_local;
  string *description_local;
  string *name_local;
  Context *ctx_local;
  SeparateShaderTest *this_local;
  
  testFunc_local = in_stack_00000010;
  local_48 = testFunc;
  local_38 = params;
  params_local._4_4_ = iterations;
  psStack_28 = description;
  description_local = name;
  name_local = (string *)ctx;
  ctx_local = (Context *)this;
  name_00 = (char *)std::__cxx11::string::c_str();
  description_00 = (char *)std::__cxx11::string::c_str();
  gles31::TestCase::TestCase(&this->super_TestCase,ctx,name_00,description_00);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SeparateShaderTest_032b11d8;
  pRVar14 = gles31::Context::getRenderContext((Context *)name_local);
  iVar13 = (*pRVar14->_vptr_RenderContext[3])();
  SeparateShaderTest::log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  glu::CallLogWrapper::CallLogWrapper
            (&this->super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar13),log);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SeparateShaderTest_032b11d8;
  *(int *)&(this->super_CallLogWrapper).field_0x14 = params_local._4_4_;
  this->m_currentIteration = 0;
  bVar4 = local_38->initSingle;
  bVar5 = local_38->switchVtx;
  bVar6 = local_38->switchFrg;
  bVar7 = local_38->useUniform;
  bVar8 = local_38->useSameName;
  bVar9 = local_38->useCreateHelper;
  bVar10 = local_38->useProgramUniform;
  uVar11 = local_38->field_0x7;
  iVar13 = (local_38->varyings).count;
  DVar12 = (local_38->varyings).type;
  BVar1 = (local_38->varyings).binding;
  VVar2 = (local_38->varyings).vtxInterp;
  VVar3 = (local_38->varyings).frgInterp;
  (this->m_params).varyings.type = (local_38->varyings).type;
  (this->m_params).varyings.binding = BVar1;
  (this->m_params).varyings.vtxInterp = VVar2;
  (this->m_params).varyings.frgInterp = VVar3;
  (this->m_params).initSingle = bVar4;
  (this->m_params).switchVtx = bVar5;
  (this->m_params).switchFrg = bVar6;
  (this->m_params).useUniform = bVar7;
  (this->m_params).useSameName = bVar8;
  (this->m_params).useCreateHelper = bVar9;
  (this->m_params).useProgramUniform = bVar10;
  (this->m_params).field_0x7 = uVar11;
  (this->m_params).varyings.count = iVar13;
  (this->m_params).varyings.type = DVar12;
  *(TestFunc *)&this->field_0xb8 = testFunc_local;
  this->m_testFunc = local_48;
  seed = paramsSeed(local_38);
  de::Random::Random(&this->m_rnd,seed);
  SeparateShaderTest::log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"// ",&local_79);
  tcu::ResultCollector::ResultCollector(&this->m_status,log_00,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  genVaryingInterface(&this->m_varyings,&local_38->varyings,&this->m_rnd);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr(&this->m_fullProg);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr(&this->m_vtxProg);
  de::details::
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  ::MovePtr(&this->m_frgProg);
  return;
}

Assistant:

SeparateShaderTest::SeparateShaderTest (Context&			ctx,
										const string&		name,
										const string&		description,
										int					iterations,
										const TestParams&	params,
										TestFunc			testFunc)
	: TestCase			(ctx, name.c_str(), description.c_str())
	, CallLogWrapper	(ctx.getRenderContext().getFunctions(), log())
	, m_iterations		(iterations)
	, m_currentIteration(0)
	, m_params			(params)
	, m_testFunc		(testFunc)
	, m_rnd				(paramsSeed(params))
	, m_status			(log(), "// ")
	, m_varyings		(genVaryingInterface(params.varyings, m_rnd))
{
	DE_ASSERT(paramsValid(params));
	DE_ASSERT(varyingsValid(m_varyings));
}